

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall ThreadContext::InitAvailableCommit(ThreadContext *this)

{
  BOOL BVar1;
  ULONG64 UStack_18;
  BOOL success;
  ULONG64 commit;
  ThreadContext *this_local;
  
  commit = (ULONG64)this;
  BVar1 = AutoSystemInfo::GetAvailableCommit(&AutoSystemInfo::Data,&stack0xffffffffffffffe8);
  if (BVar1 == 0) {
    UStack_18 = 0xffffffffffffffff;
    AutoSystemInfo::SetAvailableCommit(&AutoSystemInfo::Data,0xffffffffffffffff);
  }
  return;
}

Assistant:

void ThreadContext::InitAvailableCommit()
{
    // Once per process: get the available commit for the process from the OS and push it to the AutoSystemInfo.
    // (This must be done lazily, outside DllMain. And it must be done from the Runtime, since the common lib
    // doesn't have access to the DelayLoadLibrary stuff.)
    ULONG64 commit;
    BOOL success = AutoSystemInfo::Data.GetAvailableCommit(&commit);
    if (!success)
    {
        commit = (ULONG64)-1;
#ifdef NTBUILD
        APP_MEMORY_INFORMATION AppMemInfo;
        success = GetWinCoreProcessThreads()->GetProcessInformation(
            GetCurrentProcess(),
            ProcessAppMemoryInfo,
            &AppMemInfo,
            sizeof(AppMemInfo));
        if (success)
        {
            commit = AppMemInfo.AvailableCommit;
        }
#endif
        AutoSystemInfo::Data.SetAvailableCommit(commit);
    }
}